

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_CutSetLastCutContains(Sbd_Cut_t **pCuts,int nCuts)

{
  Sbd_Cut_t *pSVar1;
  bool bVar2;
  int iVar3;
  Sbd_Cut_t *t;
  int fChanges;
  int k;
  int i;
  int nCuts_local;
  Sbd_Cut_t **pCuts_local;
  
  bVar2 = false;
  for (fChanges = 0; fChanges < nCuts; fChanges = fChanges + 1) {
    if (((*(uint *)&pCuts[nCuts]->field_0x14 >> 0x1c < *(uint *)&pCuts[fChanges]->field_0x14 >> 0x1c
         ) && ((pCuts[nCuts]->Sign & pCuts[fChanges]->Sign) == pCuts[nCuts]->Sign)) &&
       (iVar3 = Sbd_CutSetCutIsContainedOrder(pCuts[fChanges],pCuts[nCuts]), iVar3 != 0)) {
      *(uint *)&pCuts[fChanges]->field_0x14 =
           *(uint *)&pCuts[fChanges]->field_0x14 & 0xfffffff | 0xf0000000;
      bVar2 = true;
    }
  }
  pCuts_local._4_4_ = nCuts;
  if (bVar2) {
    t._4_4_ = 0;
    for (fChanges = 0; fChanges <= nCuts; fChanges = fChanges + 1) {
      if (*(uint *)&pCuts[fChanges]->field_0x14 >> 0x1c != 0xf) {
        if (t._4_4_ < fChanges) {
          pSVar1 = pCuts[t._4_4_];
          pCuts[t._4_4_] = pCuts[fChanges];
          pCuts[fChanges] = pSVar1;
        }
        t._4_4_ = t._4_4_ + 1;
      }
    }
    pCuts_local._4_4_ = t._4_4_ + -1;
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Sbd_CutSetLastCutContains( Sbd_Cut_t ** pCuts, int nCuts )
{
    int i, k, fChanges = 0;
    for ( i = 0; i < nCuts; i++ )
        if ( pCuts[nCuts]->nLeaves < pCuts[i]->nLeaves && (pCuts[nCuts]->Sign & pCuts[i]->Sign) == pCuts[nCuts]->Sign && Sbd_CutSetCutIsContainedOrder(pCuts[i], pCuts[nCuts]) )
            pCuts[i]->nLeaves = SBD_CUT_NO_LEAF, fChanges = 1;
    if ( !fChanges )
        return nCuts;
    for ( i = k = 0; i <= nCuts; i++ )
    {
        if ( pCuts[i]->nLeaves == SBD_CUT_NO_LEAF )
            continue;
        if ( k < i )
            ABC_SWAP( Sbd_Cut_t *, pCuts[k], pCuts[i] );
        k++;
    }
    return k - 1;
}